

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3InsertData(Fts3Table *p,sqlite3_value **apVal,sqlite3_int64 *piDocid)

{
  sqlite3_value *p_00;
  int iVar1;
  int iValue;
  sqlite3_int64 sVar2;
  sqlite3_value *local_40;
  sqlite3_value *pRowid;
  sqlite3_stmt *pContentInsert;
  sqlite3_int64 *psStack_28;
  int rc;
  sqlite3_int64 *piDocid_local;
  sqlite3_value **apVal_local;
  Fts3Table *p_local;
  
  psStack_28 = piDocid;
  piDocid_local = (sqlite3_int64 *)apVal;
  apVal_local = (sqlite3_value **)p;
  if (p->zContentTbl == (char *)0x0) {
    pContentInsert._4_4_ = fts3SqlStmt(p,0x12,(sqlite3_stmt **)&pRowid,apVal + 1);
    p_00 = pRowid;
    if ((pContentInsert._4_4_ == 0) && (apVal_local[0xb] != (sqlite3_value *)0x0)) {
      iVar1 = *(int *)(apVal_local + 6);
      iValue = sqlite3_value_int((sqlite3_value *)piDocid_local[*(int *)(apVal_local + 6) + 4]);
      pContentInsert._4_4_ = sqlite3_bind_int((sqlite3_stmt *)p_00,iVar1 + 2,iValue);
    }
    if (pContentInsert._4_4_ == 0) {
      iVar1 = sqlite3_value_type((sqlite3_value *)piDocid_local[*(int *)(apVal_local + 6) + 3]);
      if (iVar1 != 5) {
        iVar1 = sqlite3_value_type((sqlite3_value *)*piDocid_local);
        if ((iVar1 == 5) &&
           (iVar1 = sqlite3_value_type((sqlite3_value *)piDocid_local[1]), iVar1 != 5)) {
          return 1;
        }
        iVar1 = sqlite3_bind_value((sqlite3_stmt *)pRowid,1,
                                   (sqlite3_value *)piDocid_local[*(int *)(apVal_local + 6) + 3]);
        if (iVar1 != 0) {
          return iVar1;
        }
        pContentInsert._4_4_ = 0;
      }
      sqlite3_step((sqlite3_stmt *)pRowid);
      pContentInsert._4_4_ = sqlite3_reset((sqlite3_stmt *)pRowid);
      sVar2 = sqlite3_last_insert_rowid((sqlite3 *)apVal_local[3]);
      *psStack_28 = sVar2;
      p_local._4_4_ = pContentInsert._4_4_;
    }
    else {
      p_local._4_4_ = pContentInsert._4_4_;
    }
  }
  else {
    local_40 = apVal[p->nColumn + 3];
    iVar1 = sqlite3_value_type(local_40);
    if (iVar1 == 5) {
      local_40 = (sqlite3_value *)piDocid_local[1];
    }
    iVar1 = sqlite3_value_type(local_40);
    if (iVar1 == 1) {
      sVar2 = sqlite3_value_int64(local_40);
      *psStack_28 = sVar2;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = 0x13;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int fts3InsertData(
  Fts3Table *p,                   /* Full-text table */
  sqlite3_value **apVal,          /* Array of values to insert */
  sqlite3_int64 *piDocid          /* OUT: Docid for row just inserted */
){
  int rc;                         /* Return code */
  sqlite3_stmt *pContentInsert;   /* INSERT INTO %_content VALUES(...) */

  if( p->zContentTbl ){
    sqlite3_value *pRowid = apVal[p->nColumn+3];
    if( sqlite3_value_type(pRowid)==SQLITE_NULL ){
      pRowid = apVal[1];
    }
    if( sqlite3_value_type(pRowid)!=SQLITE_INTEGER ){
      return SQLITE_CONSTRAINT;
    }
    *piDocid = sqlite3_value_int64(pRowid);
    return SQLITE_OK;
  }

  /* Locate the statement handle used to insert data into the %_content
  ** table. The SQL for this statement is:
  **
  **   INSERT INTO %_content VALUES(?, ?, ?, ...)
  **
  ** The statement features N '?' variables, where N is the number of user
  ** defined columns in the FTS3 table, plus one for the docid field.
  */
  rc = fts3SqlStmt(p, SQL_CONTENT_INSERT, &pContentInsert, &apVal[1]);
  if( rc==SQLITE_OK && p->zLanguageid ){
    rc = sqlite3_bind_int(
        pContentInsert, p->nColumn+2, 
        sqlite3_value_int(apVal[p->nColumn+4])
    );
  }
  if( rc!=SQLITE_OK ) return rc;

  /* There is a quirk here. The users INSERT statement may have specified
  ** a value for the "rowid" field, for the "docid" field, or for both.
  ** Which is a problem, since "rowid" and "docid" are aliases for the
  ** same value. For example:
  **
  **   INSERT INTO fts3tbl(rowid, docid) VALUES(1, 2);
  **
  ** In FTS3, this is an error. It is an error to specify non-NULL values
  ** for both docid and some other rowid alias.
  */
  if( SQLITE_NULL!=sqlite3_value_type(apVal[3+p->nColumn]) ){
    if( SQLITE_NULL==sqlite3_value_type(apVal[0])
     && SQLITE_NULL!=sqlite3_value_type(apVal[1])
    ){
      /* A rowid/docid conflict. */
      return SQLITE_ERROR;
    }
    rc = sqlite3_bind_value(pContentInsert, 1, apVal[3+p->nColumn]);
    if( rc!=SQLITE_OK ) return rc;
  }

  /* Execute the statement to insert the record. Set *piDocid to the 
  ** new docid value. 
  */
  sqlite3_step(pContentInsert);
  rc = sqlite3_reset(pContentInsert);

  *piDocid = sqlite3_last_insert_rowid(p->db);
  return rc;
}